

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O0

void xc_mgga_initalize(xc_func_type *func,size_t np,xc_mgga_out_params *out)

{
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  xc_dimensions *dim;
  
  if (*in_RDX != 0) {
    memset((void *)*in_RDX,0,(int)in_RDI[0xb] * in_RSI * 8);
  }
  if (in_RDX[1] != 0) {
    memset((void *)in_RDX[1],0,*(int *)((long)in_RDI + 0x5c) * in_RSI * 8);
    memset((void *)in_RDX[2],0,(int)in_RDI[0xc] * in_RSI * 8);
    if ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) {
      memset((void *)in_RDX[3],0,*(int *)((long)in_RDI + 100) * in_RSI * 8);
    }
    if ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0) {
      memset((void *)in_RDX[4],0,(int)in_RDI[0xd] * in_RSI * 8);
    }
  }
  if (in_RDX[5] != 0) {
    memset((void *)in_RDX[5],0,*(int *)((long)in_RDI + 0x6c) * in_RSI * 8);
    memset((void *)in_RDX[6],0,(int)in_RDI[0xe] * in_RSI * 8);
    memset((void *)in_RDX[9],0,*(int *)((long)in_RDI + 0x7c) * in_RSI * 8);
    if ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) {
      memset((void *)in_RDX[7],0,*(int *)((long)in_RDI + 0x74) * in_RSI * 8);
      memset((void *)in_RDX[10],0,(int)in_RDI[0x10] * in_RSI * 8);
      memset((void *)in_RDX[0xc],0,(int)in_RDI[0x11] * in_RSI * 8);
    }
    if ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0) {
      memset((void *)in_RDX[8],0,(int)in_RDI[0xf] * in_RSI * 8);
      memset((void *)in_RDX[0xb],0,*(int *)((long)in_RDI + 0x84) * in_RSI * 8);
      memset((void *)in_RDX[0xe],0,(int)in_RDI[0x12] * in_RSI * 8);
    }
    if (((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0))
    {
      memset((void *)in_RDX[0xd],0,*(int *)((long)in_RDI + 0x8c) * in_RSI * 8);
    }
  }
  if (in_RDX[0xf] != 0) {
    memset((void *)in_RDX[0xf],0,*(int *)((long)in_RDI + 0x94) * in_RSI * 8);
    memset((void *)in_RDX[0x10],0,(int)in_RDI[0x13] * in_RSI * 8);
    memset((void *)in_RDX[0x13],0,*(int *)((long)in_RDI + 0xa4) * in_RSI * 8);
    memset((void *)in_RDX[0x19],0,*(int *)((long)in_RDI + 0xbc) * in_RSI * 8);
    if ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) {
      memset((void *)in_RDX[0x11],0,*(int *)((long)in_RDI + 0x9c) * in_RSI * 8);
      memset((void *)in_RDX[0x14],0,(int)in_RDI[0x15] * in_RSI * 8);
      memset((void *)in_RDX[0x16],0,(int)in_RDI[0x16] * in_RSI * 8);
      memset((void *)in_RDX[0x1a],0,(int)in_RDI[0x18] * in_RSI * 8);
      memset((void *)in_RDX[0x1c],0,(int)in_RDI[0x19] * in_RSI * 8);
      memset((void *)in_RDX[0x1f],0,*(int *)((long)in_RDI + 0xd4) * in_RSI * 8);
    }
    if ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0) {
      memset((void *)in_RDX[0x12],0,(int)in_RDI[0x14] * in_RSI * 8);
      memset((void *)in_RDX[0x15],0,*(int *)((long)in_RDI + 0xac) * in_RSI * 8);
      memset((void *)in_RDX[0x18],0,(int)in_RDI[0x17] * in_RSI * 8);
      memset((void *)in_RDX[0x1b],0,*(int *)((long)in_RDI + 0xc4) * in_RSI * 8);
      memset((void *)in_RDX[0x1e],0,(int)in_RDI[0x1a] * in_RSI * 8);
      memset((void *)in_RDX[0x22],0,(int)in_RDI[0x1c] * in_RSI * 8);
    }
    if (((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0))
    {
      memset((void *)in_RDX[0x17],0,*(int *)((long)in_RDI + 0xb4) * in_RSI * 8);
      memset((void *)in_RDX[0x1d],0,*(int *)((long)in_RDI + 0xcc) * in_RSI * 8);
      memset((void *)in_RDX[0x20],0,(int)in_RDI[0x1b] * in_RSI * 8);
      memset((void *)in_RDX[0x21],0,*(int *)((long)in_RDI + 0xdc) * in_RSI * 8);
    }
  }
  if (in_RDX[0x23] != 0) {
    memset((void *)in_RDX[0x23],0,*(int *)((long)in_RDI + 0xe4) * in_RSI * 8);
    memset((void *)in_RDX[0x24],0,(int)in_RDI[0x1d] * in_RSI * 8);
    memset((void *)in_RDX[0x27],0,*(int *)((long)in_RDI + 0xf4) * in_RSI * 8);
    memset((void *)in_RDX[0x2d],0,*(int *)((long)in_RDI + 0x10c) * in_RSI * 8);
    memset((void *)in_RDX[0x37],0,*(int *)((long)in_RDI + 0x134) * in_RSI * 8);
    if ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) {
      memset((void *)in_RDX[0x25],0,*(int *)((long)in_RDI + 0xec) * in_RSI * 8);
      memset((void *)in_RDX[0x28],0,(int)in_RDI[0x1f] * in_RSI * 8);
      memset((void *)in_RDX[0x2a],0,(int)in_RDI[0x20] * in_RSI * 8);
      memset((void *)in_RDX[0x2e],0,(int)in_RDI[0x22] * in_RSI * 8);
      memset((void *)in_RDX[0x30],0,(int)in_RDI[0x23] * in_RSI * 8);
      memset((void *)in_RDX[0x33],0,*(int *)((long)in_RDI + 0x124) * in_RSI * 8);
      memset((void *)in_RDX[0x38],0,(int)in_RDI[0x27] * in_RSI * 8);
      memset((void *)in_RDX[0x3a],0,(int)in_RDI[0x28] * in_RSI * 8);
      memset((void *)in_RDX[0x3d],0,*(int *)((long)in_RDI + 0x14c) * in_RSI * 8);
      memset((void *)in_RDX[0x41],0,*(int *)((long)in_RDI + 0x15c) * in_RSI * 8);
    }
    if ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0) {
      memset((void *)in_RDX[0x26],0,(int)in_RDI[0x1e] * in_RSI * 8);
      memset((void *)in_RDX[0x29],0,*(int *)((long)in_RDI + 0xfc) * in_RSI * 8);
      memset((void *)in_RDX[0x2c],0,(int)in_RDI[0x21] * in_RSI * 8);
      memset((void *)in_RDX[0x2f],0,*(int *)((long)in_RDI + 0x114) * in_RSI * 8);
      memset((void *)in_RDX[0x32],0,(int)in_RDI[0x24] * in_RSI * 8);
      memset((void *)in_RDX[0x36],0,(int)in_RDI[0x26] * in_RSI * 8);
      memset((void *)in_RDX[0x39],0,*(int *)((long)in_RDI + 0x13c) * in_RSI * 8);
      memset((void *)in_RDX[0x3c],0,(int)in_RDI[0x29] * in_RSI * 8);
      memset((void *)in_RDX[0x40],0,(int)in_RDI[0x2b] * in_RSI * 8);
      memset((void *)in_RDX[0x45],0,*(int *)((long)in_RDI + 0x16c) * in_RSI * 8);
    }
    if (((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0))
    {
      memset((void *)in_RDX[0x2b],0,*(int *)((long)in_RDI + 0x104) * in_RSI * 8);
      memset((void *)in_RDX[0x31],0,*(int *)((long)in_RDI + 0x11c) * in_RSI * 8);
      memset((void *)in_RDX[0x34],0,(int)in_RDI[0x25] * in_RSI * 8);
      memset((void *)in_RDX[0x35],0,*(int *)((long)in_RDI + 300) * in_RSI * 8);
      memset((void *)in_RDX[0x3b],0,*(int *)((long)in_RDI + 0x144) * in_RSI * 8);
      memset((void *)in_RDX[0x3e],0,(int)in_RDI[0x2a] * in_RSI * 8);
      memset((void *)in_RDX[0x3f],0,*(int *)((long)in_RDI + 0x154) * in_RSI * 8);
      memset((void *)in_RDX[0x42],0,(int)in_RDI[0x2c] * in_RSI * 8);
      memset((void *)in_RDX[0x43],0,*(int *)((long)in_RDI + 0x164) * in_RSI * 8);
      memset((void *)in_RDX[0x44],0,(int)in_RDI[0x2d] * in_RSI * 8);
    }
  }
  return;
}

Assistant:

void
xc_mgga_initalize(const xc_func_type *func, size_t np, xc_mgga_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

  /* initialize output to zero */
  if(out->zk != NULL)
    libxc_memset(out->zk, 0, dim->zk*np*sizeof(double));

  if(out->vrho != NULL){
    libxc_memset(out->vrho,   0, dim->vrho  *np*sizeof(double));
    libxc_memset(out->vsigma, 0, dim->vsigma*np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
      libxc_memset(out->vlapl,  0, dim->vlapl *np*sizeof(double));
    }
    if(func->info->flags & XC_FLAGS_NEEDS_TAU) {
      libxc_memset(out->vtau,   0, dim->vtau  *np*sizeof(double));
    }
  }

  if(out->v2rho2 != NULL){
    libxc_memset(out->v2rho2,     0, dim->v2rho2     *np*sizeof(double));
    libxc_memset(out->v2rhosigma, 0, dim->v2rhosigma *np*sizeof(double));
    libxc_memset(out->v2sigma2,   0, dim->v2sigma2   *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v2rholapl,   0, dim->v2rholapl  *np*sizeof(double));
      libxc_memset(out->v2sigmalapl, 0, dim->v2sigmalapl*np*sizeof(double));
      libxc_memset(out->v2lapl2,     0, dim->v2lapl2    *np*sizeof(double));
    }
    
    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v2rhotau,   0, dim->v2rhotau   *np*sizeof(double));
      libxc_memset(out->v2sigmatau, 0, dim->v2sigmatau *np*sizeof(double));
      libxc_memset(out->v2tau2,     0, dim->v2tau2     *np*sizeof(double));
    }
    
    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v2lapltau,   0, dim->v2lapltau  *np*sizeof(double));
    }
  }

  if(out->v3rho3 != NULL){
    libxc_memset(out->v3rho3,        0, dim->v3rho3       *np*sizeof(double));
    libxc_memset(out->v3rho2sigma,   0, dim->v3rho2sigma  *np*sizeof(double));
    libxc_memset(out->v3rhosigma2,   0, dim->v3rhosigma2  *np*sizeof(double));
    libxc_memset(out->v3sigma3,      0, dim->v3sigma3     *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v3rho2lapl,     0, dim->v3rho2lapl    *np*sizeof(double));
      libxc_memset(out->v3rhosigmalapl, 0, dim->v3rhosigmalapl*np*sizeof(double));
      libxc_memset(out->v3rholapl2,     0, dim->v3rholapl2    *np*sizeof(double));
      libxc_memset(out->v3sigma2lapl,   0, dim->v3sigma2lapl  *np*sizeof(double));
      libxc_memset(out->v3sigmalapl2,   0, dim->v3sigmalapl2  *np*sizeof(double));
      libxc_memset(out->v3lapl3,        0, dim->v3lapl3       *np*sizeof(double));
    }

    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v3rho2tau,     0, dim->v3rho2tau    *np*sizeof(double));
      libxc_memset(out->v3rhosigmatau, 0, dim->v3rhosigmatau*np*sizeof(double));
      libxc_memset(out->v3rhotau2,     0, dim->v3rhotau2    *np*sizeof(double));
      libxc_memset(out->v3sigma2tau,   0, dim->v3sigma2tau  *np*sizeof(double));
      libxc_memset(out->v3sigmatau2,   0, dim->v3sigmatau2  *np*sizeof(double));
      libxc_memset(out->v3tau3,        0, dim->v3tau3       *np*sizeof(double));
    }

    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v3rholapltau,   0, dim->v3rholapltau  *np*sizeof(double));
      libxc_memset(out->v3sigmalapltau, 0, dim->v3sigmalapltau*np*sizeof(double));
      libxc_memset(out->v3lapl2tau,     0, dim->v3lapl2tau    *np*sizeof(double));
      libxc_memset(out->v3lapltau2,     0, dim->v3lapltau2    *np*sizeof(double));
    }
  }

  if(out->v4rho4 != NULL){
    libxc_memset(out->v4rho4,         0, dim->v4rho4        *np*sizeof(double));
    libxc_memset(out->v4rho3sigma,    0, dim->v4rho3sigma   *np*sizeof(double));
    libxc_memset(out->v4rho2sigma2,   0, dim->v4rho2sigma2  *np*sizeof(double));
    libxc_memset(out->v4rhosigma3,    0, dim->v4rhosigma3   *np*sizeof(double));
    libxc_memset(out->v4sigma4,       0, dim->v4sigma4      *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v4rho3lapl,        0, dim->v4rho3lapl       *np*sizeof(double));
      libxc_memset(out->v4rho2sigmalapl,   0, dim->v4rho2sigmalapl  *np*sizeof(double));
      libxc_memset(out->v4rho2lapl2,       0, dim->v4rho2lapl2      *np*sizeof(double));
      libxc_memset(out->v4rhosigma2lapl,   0, dim->v4rhosigma2lapl  *np*sizeof(double));
      libxc_memset(out->v4rhosigmalapl2,   0, dim->v4rhosigmalapl2  *np*sizeof(double));
      libxc_memset(out->v4rholapl3,        0, dim->v4rholapl3       *np*sizeof(double));
      libxc_memset(out->v4sigma3lapl,      0, dim->v4sigma3lapl     *np*sizeof(double));
      libxc_memset(out->v4sigma2lapl2,     0, dim->v4sigma2lapl2    *np*sizeof(double));
      libxc_memset(out->v4sigmalapl3,      0, dim->v4sigmalapl3     *np*sizeof(double));
      libxc_memset(out->v4lapl4,           0, dim->v4lapl4          *np*sizeof(double));
    }

    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v4rho3tau,      0, dim->v4rho3tau     *np*sizeof(double));
      libxc_memset(out->v4rho2sigmatau, 0, dim->v4rho2sigmatau*np*sizeof(double));
      libxc_memset(out->v4rho2tau2,     0, dim->v4rho2tau2    *np*sizeof(double));
      libxc_memset(out->v4rhosigma2tau, 0, dim->v4rhosigma2tau*np*sizeof(double));
      libxc_memset(out->v4rhosigmatau2, 0, dim->v4rhosigmatau2*np*sizeof(double));
      libxc_memset(out->v4rhotau3,      0, dim->v4rhotau3     *np*sizeof(double));
      libxc_memset(out->v4sigma3tau,    0, dim->v4sigma3tau   *np*sizeof(double));
      libxc_memset(out->v4sigma2tau2,   0, dim->v4sigma2tau2  *np*sizeof(double));
      libxc_memset(out->v4sigmatau3,    0, dim->v4sigmatau3   *np*sizeof(double));
      libxc_memset(out->v4tau4,         0, dim->v4tau4        *np*sizeof(double));
    }

    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v4rho2lapltau,     0, dim->v4rho2lapltau    *np*sizeof(double));
      libxc_memset(out->v4rhosigmalapltau, 0, dim->v4rhosigmalapltau*np*sizeof(double));
      libxc_memset(out->v4rholapl2tau,     0, dim->v4rholapl2tau    *np*sizeof(double));
      libxc_memset(out->v4rholapltau2,     0, dim->v4rholapltau2    *np*sizeof(double));
      libxc_memset(out->v4sigma2lapltau,   0, dim->v4sigma2lapltau  *np*sizeof(double));
      libxc_memset(out->v4sigmalapl2tau,   0, dim->v4sigmalapl2tau  *np*sizeof(double));
      libxc_memset(out->v4sigmalapltau2,   0, dim->v4sigmalapltau2  *np*sizeof(double));
      libxc_memset(out->v4lapl3tau,        0, dim->v4lapl3tau       *np*sizeof(double));
      libxc_memset(out->v4lapl2tau2,       0, dim->v4lapl2tau2      *np*sizeof(double));
      libxc_memset(out->v4lapltau3,        0, dim->v4lapltau3       *np*sizeof(double));
    }
  }

}